

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O0

LengthMod __thiscall absl::str_format_internal::ConvTag::as_length(ConvTag *this)

{
  bool bVar1;
  ConvTag *this_local;
  
  bVar1 = is_conv(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_conv()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x69,"LengthMod absl::str_format_internal::ConvTag::as_length() const");
  }
  bVar1 = is_length(this);
  if (!bVar1) {
    __assert_fail("is_length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x6a,"LengthMod absl::str_format_internal::ConvTag::as_length() const");
  }
  bVar1 = is_flags(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_flags()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x6b,"LengthMod absl::str_format_internal::ConvTag::as_length() const");
  }
  return this->tag_ & 0x3f;
}

Assistant:

constexpr LengthMod as_length() const {
    assert(!is_conv());
    assert(is_length());
    assert(!is_flags());
    return static_cast<LengthMod>(tag_ & 0x3F);
  }